

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

CURLcode Curl_loadhostpairs(SessionHandle *data)

{
  int iVar1;
  Curl_addrinfo *addr;
  char *pcVar2;
  size_t sVar3;
  void *pvVar4;
  Curl_dns_entry *pCVar5;
  curl_slist *pcVar6;
  bool bVar7;
  int port;
  char address [256];
  char hostname [256];
  uint local_23c;
  char local_238 [256];
  char local_138 [264];
  
  pcVar6 = (data->change).resolve;
  if (pcVar6 != (curl_slist *)0x0) {
    do {
      pcVar2 = pcVar6->data;
      if (((pcVar2 != (char *)0x0) && (*pcVar2 != '-')) &&
         (iVar1 = __isoc99_sscanf(pcVar2,"%255[^:]:%d:%255s",local_138,&local_23c,local_238),
         iVar1 == 3)) {
        addr = Curl_str2addr(local_238,local_23c);
        if (addr == (Curl_addrinfo *)0x0) {
          Curl_infof(data,"Resolve %s found illegal!\n",pcVar6->data);
        }
        else {
          pcVar2 = create_hostcache_id(local_138,local_23c);
          if (pcVar2 == (char *)0x0) {
LAB_004b0d4d:
            Curl_freeaddrinfo(addr);
            return CURLE_OUT_OF_MEMORY;
          }
          sVar3 = strlen(pcVar2);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
          }
          pvVar4 = Curl_hash_pick((data->dns).hostcache,pcVar2,sVar3 + 1);
          (*Curl_cfree)(pcVar2);
          if (pvVar4 == (void *)0x0) {
            pCVar5 = Curl_cache_addr(data,addr,local_138,local_23c);
            bVar7 = pCVar5 == (Curl_dns_entry *)0x0;
          }
          else {
            Curl_freeaddrinfo(addr);
            bVar7 = false;
          }
          if (data->share != (Curl_share *)0x0) {
            Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
          }
          if (bVar7) goto LAB_004b0d4d;
          Curl_infof(data,"Added %s:%d:%s to DNS cache\n",local_138,(ulong)local_23c,local_238);
        }
      }
      pcVar6 = pcVar6->next;
    } while (pcVar6 != (curl_slist *)0x0);
  }
  (data->change).resolve = (curl_slist *)0x0;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_loadhostpairs(struct SessionHandle *data)
{
  struct curl_slist *hostp;
  char hostname[256];
  char address[256];
  int port;

  for(hostp = data->change.resolve; hostp; hostp = hostp->next ) {
    if(!hostp->data)
      continue;
    if(hostp->data[0] == '-') {
      /* TODO: mark an entry for removal */
    }
    else if(3 == sscanf(hostp->data, "%255[^:]:%d:%255s", hostname, &port,
                        address)) {
      struct Curl_dns_entry *dns;
      Curl_addrinfo *addr;
      char *entry_id;
      size_t entry_len;

      addr = Curl_str2addr(address, port);
      if(!addr) {
        infof(data, "Resolve %s found illegal!\n", hostp->data);
        continue;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_id = create_hostcache_id(hostname, port);
      /* If we can't create the entry id, fail */
      if(!entry_id) {
        Curl_freeaddrinfo(addr);
        return CURLE_OUT_OF_MEMORY;
      }

      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* See if its already in our dns cache */
      dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len+1);

      /* free the allocated entry_id again */
      free(entry_id);

      if(!dns)
        /* if not in the cache already, put this host in the cache */
        dns = Curl_cache_addr(data, addr, hostname, port);
      else
        /* this is a duplicate, free it again */
        Curl_freeaddrinfo(addr);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        Curl_freeaddrinfo(addr);
        return CURLE_OUT_OF_MEMORY;
      }
      infof(data, "Added %s:%d:%s to DNS cache\n",
            hostname, port, address);
    }
  }
  data->change.resolve = NULL; /* dealt with now */

  return CURLE_OK;
}